

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_UpdDomain_Test::~PersistentStorageJsonTestSuite_UpdDomain_Test
          (PersistentStorageJsonTestSuite_UpdDomain_Test *this)

{
  PersistentStorageJsonTestSuite_UpdDomain_Test *this_local;
  
  ~PersistentStorageJsonTestSuite_UpdDomain_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, UpdDomain)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Add initial data
    DomainId newId;

    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom1"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom2"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom3"}, newId) == PersistentStorage::Status::kSuccess);

    // Test actions
    Domain newValue{EMPTY_ID, "dom_upd"};

    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kNotFound);
    newValue.mId = 1;
    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kSuccess);

    Domain returnValue;

    EXPECT_TRUE(psj.Get(DomainId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mName == "dom_upd");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}